

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTetrahedronFace.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChTetrahedronFace::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChTetrahedronFace *this,double U,double V)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVector<double> *v;
  int i;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  ChLoadableUV local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  undefined1 auVar18 [16];
  
  i = (int)this;
  GetNodeN((ChTetrahedronFace *)&local_28,i);
  dVar16 = *(double *)((long)local_28 + 0x20);
  dVar8 = *(double *)((long)local_28 + 0x28);
  dVar1 = *(double *)((long)local_28 + 0x30);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  GetNodeN((ChTetrahedronFace *)&local_28,i);
  dVar2 = *(double *)((long)local_28 + 0x20);
  dVar3 = *(double *)((long)local_28 + 0x28);
  dVar4 = *(double *)((long)local_28 + 0x30);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  GetNodeN((ChTetrahedronFace *)&local_28,i);
  dVar5 = *(double *)((long)local_28 + 0x20);
  dVar6 = *(double *)((long)local_28 + 0x28);
  dVar7 = *(double *)((long)local_28 + 0x30);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  dVar2 = dVar2 - dVar16;
  dVar3 = dVar3 - dVar8;
  dVar4 = dVar4 - dVar1;
  dVar5 = dVar5 - dVar16;
  dVar6 = dVar6 - dVar8;
  dVar7 = dVar7 - dVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar7;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar6 * dVar4;
  auVar11 = vfmsub231sd_fma(auVar19,auVar11,auVar17);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar7 * dVar2;
  auVar9 = vfmsub231sd_fma(auVar18,auVar14,auVar12);
  dVar16 = auVar9._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar5 * dVar3;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar6;
  auVar12 = vfmsub231sd_fma(auVar13,auVar9,auVar15);
  __return_storage_ptr__->m_data[0] = auVar11._0_8_;
  __return_storage_ptr__->m_data[1] = dVar16;
  __return_storage_ptr__->m_data[2] = auVar12._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar16 * dVar16;
  auVar9 = vfmadd231sd_fma(auVar10,auVar11,auVar11);
  auVar9 = vfmadd231sd_fma(auVar9,auVar12,auVar12);
  if (auVar9._0_8_ < 0.0) {
    dVar8 = sqrt(auVar9._0_8_);
  }
  else {
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar8 = auVar9._0_8_;
  }
  if (dVar8 < 2.2250738585072014e-308) {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    dVar8 = 0.0;
  }
  else {
    dVar8 = 1.0 / dVar8;
    __return_storage_ptr__->m_data[0] = auVar11._0_8_ * dVar8;
    __return_storage_ptr__->m_data[1] = dVar16 * dVar8;
    dVar8 = auVar12._0_8_ * dVar8;
  }
  __return_storage_ptr__->m_data[2] = dVar8;
  return __return_storage_ptr__;
}

Assistant:

virtual ChVector<> ComputeNormal(const double U, const double V) override {
        ChVector<> p0 = GetNodeN(0)->GetPos();
        ChVector<> p1 = GetNodeN(1)->GetPos();
        ChVector<> p2 = GetNodeN(2)->GetPos();
        return Vcross(p1 - p0, p2 - p0).GetNormalized();
    }